

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O1

void set_selected_from_list(Am_Object *inter,Am_Value_List *all_objects,Am_Value_List *new_value)

{
  bool bVar1;
  bool value;
  Am_Value *pAVar2;
  Am_Wrapper *value_00;
  Am_Object current;
  Am_Object local_28;
  
  local_28.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(all_objects);
  while( true ) {
    bVar1 = Am_Value_List::Last(all_objects);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(all_objects);
    Am_Object::operator=(&local_28,pAVar2);
    pAVar2 = Am_Object::Get(&local_28,0x172,3);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
    Am_Value_List::Start(new_value);
    value_00 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
    value = Am_Value_List::Member(new_value,value_00);
    if (value != bVar1) {
      Am_Object::Set(&local_28,0x172,value,1);
    }
    Am_Value_List::Next(all_objects);
  }
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
set_selected_from_list(Am_Object &inter, Am_Value_List &all_objects,
                       Am_Value_List &new_value)
{
  Am_Object current;
  bool old_sel;
  for (all_objects.Start(); !all_objects.Last(); all_objects.Next()) {
    current = all_objects.Get();
    old_sel = current.Get(Am_SELECTED, Am_RETURN_ZERO_ON_ERROR);
    new_value.Start();
    if (new_value.Member(current)) {
      if (!old_sel) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, true);
        current.Set(Am_SELECTED, true, Am_OK_IF_NOT_THERE);
      }
    } else {
      if (old_sel) {
        Am_REPORT_SET_SEL_VALUE(true, inter, current, false);
        current.Set(Am_SELECTED, false, Am_OK_IF_NOT_THERE);
      }
    }
  }
}